

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * atomimm(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  matches *pmVar2;
  expr *peVar3;
  ull uVar4;
  expr **ppeVar5;
  int iVar6;
  
  if (ctx->reverse != 0) {
    pmVar2 = matchimm(ctx,(bitfield *)v,spos);
    return pmVar2;
  }
  peVar3 = (expr *)calloc(0x48,1);
  uVar4 = getbf((bitfield *)v,a,m,ctx);
  peVar3->num1 = uVar4;
  iVar6 = ctx->atomsnum;
  iVar1 = ctx->atomsmax;
  if (iVar6 < iVar1) {
    ppeVar5 = ctx->atoms;
  }
  else {
    iVar6 = 0x10;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    ctx->atomsmax = iVar6;
    ppeVar5 = (expr **)realloc(ctx->atoms,(long)iVar6 << 3);
    ctx->atoms = ppeVar5;
    iVar6 = ctx->atomsnum;
  }
  ctx->atomsnum = iVar6 + 1;
  ppeVar5[iVar6] = peVar3;
  return (matches *)0x0;
}

Assistant:

struct matches *atomimm APROTO {
	const struct bitfield *bf = v;
	if (ctx->reverse)
		return matchimm(ctx, bf, spos);
	struct expr *expr = makeex(EXPR_NUM);
	expr->num1 = GETBF(bf);
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}